

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

string * adios2::helper::GetFQDN_abi_cxx11_(void)

{
  addrinfo *paVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  string *in_RDI;
  addrinfo **__pai;
  allocator local_461;
  addrinfo *info;
  addrinfo local_458;
  char hostname [1024];
  
  hostname[0x3ff] = '\0';
  gethostname(hostname,0x3ff);
  local_458.ai_addrlen = 0;
  local_458._20_4_ = 0;
  local_458.ai_addr = (sockaddr *)0x0;
  local_458.ai_canonname = (char *)0x0;
  local_458.ai_next = (addrinfo *)0x0;
  local_458.ai_socktype = 1;
  local_458.ai_protocol = 0;
  local_458.ai_flags = 2;
  local_458.ai_family = 0;
  __pai = (addrinfo **)&info;
  iVar2 = getaddrinfo(hostname,(char *)0x0,&local_458,__pai);
  if (iVar2 == 0) {
    do {
      paVar1 = *__pai;
      if (paVar1 == (addrinfo *)0x0) goto LAB_00462631;
      __s = paVar1->ai_canonname;
      pcVar3 = strchr(__s,0x2e);
      __pai = &paVar1->ai_next;
    } while (pcVar3 == (char *)0x0);
    strncpy(hostname,__s,0x3ff);
  }
  else {
    builtin_strncpy(hostname,"Unknown_Host_Name",0x12);
  }
LAB_00462631:
  freeaddrinfo((addrinfo *)info);
  std::__cxx11::string::string((string *)in_RDI,hostname,&local_461);
  return in_RDI;
}

Assistant:

std::string GetFQDN() noexcept
{
    char hostname[1024];
#ifdef WIN32
    TCHAR infoBuf[1024];
    DWORD bufCharCount = sizeof(hostname);
    memset(hostname, 0, sizeof(hostname));
    if (GetComputerName(infoBuf, &bufCharCount))
    {
        int i;
        for (i = 0; i < sizeof(hostname); i++)
        {
            hostname[i] = infoBuf[i];
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
#else
    struct addrinfo hints, *info, *p;

    hostname[1023] = '\0';
    gethostname(hostname, 1023);

    memset(&hints, 0, sizeof hints);
    hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_flags = AI_CANONNAME;

    if (getaddrinfo(hostname, NULL, &hints, &info) == 0)
    {
        for (p = info; p != NULL; p = p->ai_next)
        {
            // printf("hostname: %s\n", p->ai_canonname);
            if (strchr(p->ai_canonname, '.') != NULL)
            {
                strncpy(hostname, p->ai_canonname, sizeof(hostname) - 1);
                break;
            }
        }
    }
    else
    {
        strcpy(hostname, "Unknown_Host_Name");
    }
    freeaddrinfo(info);
#endif
    return std::string(hostname);
}